

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O1

void __thiscall helics::Federate::setAsyncCheck(Federate *this,function<bool_()> *asyncCheck)

{
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *psVar1;
  handle asyncInfo;
  unique_lock<std::mutex> local_20;
  
  if (this->singleThreadFederate == false) {
    psVar1 = (this->asyncCallInfo)._M_t.
             super___uniq_ptr_impl<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
             .
             super__Head_base<0UL,_gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_*,_false>
             ._M_head_impl;
    local_20._M_device = &psVar1->m_mutex;
    local_20._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_20);
    local_20._M_owns = true;
    std::function<bool_()>::operator=(&(psVar1->m_obj).asyncCheck,asyncCheck);
    std::unique_lock<std::mutex>::~unique_lock(&local_20);
  }
  return;
}

Assistant:

void Federate::setAsyncCheck(std::function<bool()> asyncCheck)
{
    if (singleThreadFederate) {
        return;
    }
    auto asyncInfo = asyncCallInfo->lock();
    asyncInfo->asyncCheck = std::move(asyncCheck);
}